

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

bool wasm::anon_unknown_0::shapeEq(Type a,Type b)

{
  bool bVar1;
  Nullability NVar2;
  Nullability NVar3;
  Tuple *a_00;
  Tuple *b_00;
  bool local_39;
  HeapType local_30;
  HeapType local_28;
  Type local_20;
  Type b_local;
  Type a_local;
  
  local_20.id = b.id;
  b_local = a;
  bVar1 = wasm::Type::operator==(&b_local,&local_20);
  if (bVar1) {
    a_local.id._7_1_ = true;
  }
  else {
    bVar1 = wasm::Type::isTuple(&b_local);
    if ((bVar1) && (bVar1 = wasm::Type::isTuple(&local_20), bVar1)) {
      a_00 = wasm::Type::getTuple(&b_local);
      b_00 = wasm::Type::getTuple(&local_20);
      a_local.id._7_1_ = shapeEq(a_00,b_00);
    }
    else {
      bVar1 = wasm::Type::isRef(&b_local);
      if ((bVar1) && (bVar1 = wasm::Type::isRef(&local_20), bVar1)) {
        local_28 = wasm::Type::getHeapType(&b_local);
        bVar1 = HeapType::isBasic(&local_28);
        local_39 = true;
        if (!bVar1) {
          local_30 = wasm::Type::getHeapType(&local_20);
          local_39 = HeapType::isBasic(&local_30);
        }
        if (local_39 == false) {
          NVar2 = wasm::Type::getNullability(&b_local);
          NVar3 = wasm::Type::getNullability(&local_20);
          if (NVar2 == NVar3) {
            a_local.id._7_1_ = true;
          }
          else {
            a_local.id._7_1_ = false;
          }
        }
        else {
          a_local.id._7_1_ = false;
        }
      }
      else {
        a_local.id._7_1_ = false;
      }
    }
  }
  return a_local.id._7_1_;
}

Assistant:

bool shapeEq(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return shapeEq(a.getTuple(), b.getTuple());
  }
  // The only thing allowed to differ is the non-basic heap type child, since we
  // don't know before running the DFA partition refinement whether different
  // heap type children will end up being merged. Children that won't be merged
  // will end up being differentiated by the partition refinement.
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.getHeapType().isBasic() || b.getHeapType().isBasic()) {
    return false;
  }
  if (a.getNullability() != b.getNullability()) {
    return false;
  }
  return true;
}